

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O1

void __thiscall QRhiWidget::~QRhiWidget(QRhiWidget *this)

{
  QRhiWidgetPrivate *this_00;
  long lVar1;
  QRhiResource **ppQVar2;
  long *plVar3;
  long lVar4;
  
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007f3290;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QRhiWidget_007f3458;
  this_00 = *(QRhiWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if (this_00->rhi != (QRhi *)0x0) {
    QRhi::removeCleanupCallback(this_00->rhi);
    QRhiWidgetPrivate::resetRenderTargetObjects(this_00);
    QRhiWidgetPrivate::resetColorBufferObjects(this_00);
    lVar1 = (this_00->pendingDeletes).d.size;
    if (lVar1 != 0) {
      ppQVar2 = (this_00->pendingDeletes).d.ptr;
      lVar4 = 0;
      do {
        plVar3 = *(long **)((long)ppQVar2 + lVar4);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
        lVar4 = lVar4 + 8;
      } while (lVar1 << 3 != lVar4);
    }
  }
  QBackingStoreRhiSupport::reset();
  QWidget::~QWidget(&this->super_QWidget);
  return;
}

Assistant:

QRhiWidget::~QRhiWidget()
{
    Q_D(QRhiWidget);

    if (d->rhi) {
        d->rhi->removeCleanupCallback(this);
        // rhi resources must be destroyed here, due to how QWidget teardown works;
        // it should not be left to the private object's destruction.
        d->resetRenderTargetObjects();
        d->resetColorBufferObjects();
        qDeleteAll(d->pendingDeletes);
    }

    d->offscreenRenderer.reset();
}